

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O1

void __thiscall
spvtools::opt::VectorDCE::FindLiveComponents
          (VectorDCE *this,Function *function,LiveComponentMap *live_components)

{
  BitVector *live_elements;
  undefined8 current_inst;
  bool bVar1;
  ulong uVar2;
  BitVector *live_elements_00;
  ulong uVar3;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  work_list;
  WorkListItem current_item;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  local_98;
  undefined1 local_78 [16];
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  BitVector *local_58;
  WorkListItem local_50;
  
  local_98.
  super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = (_Invoker_type)0x0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_8_ = (void *)0x0;
  local_78._0_8_ = operator_new(0x18);
  (((Instruction *)local_78._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  _vptr_IntrusiveNodeBase = (_func_int **)&local_98;
  (((Instruction *)local_78._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_
       = (Instruction *)this;
  (((Instruction *)local_78._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  previous_node_ = (Instruction *)live_components;
  p_Stack_60 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:52:7)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:52:7)>
             ::_M_manager;
  opt::Function::ForEachInst
            (function,(function<void_(spvtools::opt::Instruction_*)> *)local_78,false,false);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
  }
  if (local_98.
      super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_98.
      super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    live_elements = (BitVector *)(local_78 + 8);
    local_58 = &this->all_components_live_;
    uVar2 = 0;
    uVar3 = 1;
    do {
      local_78._0_8_ =
           local_98.
           super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar2].instruction;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)live_elements,
                 &local_98.
                  super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar2].components.bits_);
      current_inst = local_78._0_8_;
      switch(*(Op *)(local_78._0_8_ + 0x28)) {
      case OpVectorShuffle:
        MarkVectorShuffleUsesAsLive(this,(WorkListItem *)local_78,live_components,&local_98);
        break;
      case OpCompositeConstruct:
        local_50.instruction = (Instruction *)local_78._0_8_;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_50.components.bits_,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)live_elements);
        MarkCompositeContructUsesAsLive(this,&local_50,live_components,&local_98);
        if (local_50.components.bits_.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.components.bits_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.components.bits_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.components.bits_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        break;
      case OpCompositeExtract:
        MarkExtractUseAsLive
                  (this,(Instruction *)local_78._0_8_,live_elements,live_components,&local_98);
        break;
      case OpCompositeInsert:
        MarkInsertUsesAsLive(this,(WorkListItem *)local_78,live_components,&local_98);
        break;
      default:
        bVar1 = Instruction::IsScalarizable((Instruction *)local_78._0_8_);
        live_elements_00 = local_58;
        if (bVar1) {
          live_elements_00 = live_elements;
        }
        MarkUsesAsLive(this,(Instruction *)current_inst,live_elements_00,live_components,&local_98);
      }
      if ((void *)local_78._8_8_ != (void *)0x0) {
        operator_delete((void *)local_78._8_8_,(long)p_Stack_60 - local_78._8_8_);
      }
      bVar1 = uVar3 < (ulong)((long)local_98.
                                    super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_98.
                                    super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  std::
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void VectorDCE::FindLiveComponents(Function* function,
                                   LiveComponentMap* live_components) {
  std::vector<WorkListItem> work_list;

  // Prime the work list.  We will assume that any instruction that does
  // not result in a vector is live.
  //
  // Extending to structures and matrices is not as straight forward because of
  // the nesting.  We cannot simply us a bit vector to keep track of which
  // components are live because of arbitrary nesting of structs.
  function->ForEachInst(
      [&work_list, this, live_components](Instruction* current_inst) {
        if (current_inst->IsCommonDebugInstr()) {
          return;
        }
        if (!HasVectorOrScalarResult(current_inst) ||
            !context()->IsCombinatorInstruction(current_inst)) {
          MarkUsesAsLive(current_inst, all_components_live_, live_components,
                         &work_list);
        }
      });

  // Process the work list propagating liveness.
  for (uint32_t i = 0; i < work_list.size(); i++) {
    WorkListItem current_item = work_list[i];
    Instruction* current_inst = current_item.instruction;

    switch (current_inst->opcode()) {
      case spv::Op::OpCompositeExtract:
        MarkExtractUseAsLive(current_inst, current_item.components,
                             live_components, &work_list);
        break;
      case spv::Op::OpCompositeInsert:
        MarkInsertUsesAsLive(current_item, live_components, &work_list);
        break;
      case spv::Op::OpVectorShuffle:
        MarkVectorShuffleUsesAsLive(current_item, live_components, &work_list);
        break;
      case spv::Op::OpCompositeConstruct:
        MarkCompositeContructUsesAsLive(current_item, live_components,
                                        &work_list);
        break;
      default:
        if (current_inst->IsScalarizable()) {
          MarkUsesAsLive(current_inst, current_item.components, live_components,
                         &work_list);
        } else {
          MarkUsesAsLive(current_inst, all_components_live_, live_components,
                         &work_list);
        }
        break;
    }
  }
}